

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O0

Expression * __thiscall soul::StructuralParser::parseBitwiseAnd(StructuralParser *this)

{
  bool bVar1;
  Expression *pEVar2;
  Expression *b;
  pool_ref<soul::AST::Expression> local_58;
  char *local_50;
  undefined1 local_38 [8];
  Context context;
  pool_ref<soul::AST::Expression> local_18;
  pool_ref<soul::AST::Expression> a;
  StructuralParser *this_local;
  
  a.object = (Expression *)this;
  pEVar2 = parseEqualityOperator(this);
  pool_ref<soul::AST::Expression>::pool_ref<soul::AST::Expression,void>(&local_18,pEVar2);
  while( true ) {
    context.parentScope = (Scope *)0x4d3e8d;
    bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
            ::matches(&this->super_SOULTokeniser,(TokenType)0x4d3e8d);
    if (!bVar1) break;
    getContext((Context *)local_38,this);
    local_50 = (char *)Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                       ::skip(&this->super_SOULTokeniser);
    pEVar2 = pool_ref::operator_cast_to_Expression_((pool_ref *)&local_18);
    b = parseEqualityOperator(this);
    pEVar2 = createBinaryOperator(this,(Context *)local_38,pEVar2,b,bitwiseAnd);
    pool_ref<soul::AST::Expression>::pool_ref<soul::AST::Expression,void>(&local_58,pEVar2);
    local_18.object = local_58.object;
    pool_ref<soul::AST::Expression>::~pool_ref(&local_58);
    AST::Context::~Context((Context *)local_38);
  }
  pEVar2 = pool_ref::operator_cast_to_Expression_((pool_ref *)&local_18);
  pool_ref<soul::AST::Expression>::~pool_ref(&local_18);
  return pEVar2;
}

Assistant:

AST::Expression& parseBitwiseAnd()
    {
        for (pool_ref<AST::Expression> a = parseEqualityOperator();;)
        {
            if (! matches (Operator::bitwiseAnd))
                return a;

            auto context = getContext();
            skip();
            a = createBinaryOperator (context, a, parseEqualityOperator(), BinaryOp::Op::bitwiseAnd);
        }
    }